

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

bool __thiscall wallet::SQLiteDatabase::Backup(SQLiteDatabase *this,string *dest)

{
  long lVar1;
  int iVar2;
  long lVar3;
  char (*pacVar4) [7];
  long in_FS_OFFSET;
  bool bVar5;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  sqlite3 *db_copy;
  char *in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_open((dest->_M_dataplus)._M_p,&stack0xffffffffffffffe0);
  if (iVar2 == 0) {
    lVar3 = sqlite3_backup_init(in_stack_ffffffffffffffe0,"main",this->m_db);
    if (lVar3 == 0) {
      pacVar4 = (char (*) [7])sqlite3_errmsg(this->m_db);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x5a;
      logging_function._M_str = "Backup";
      logging_function._M_len = 6;
      LogPrintf_<char[7],char_const*>
                (logging_function,source_file,0x164,0x1139755,(Level)&stack0xffffffffffffffd8,
                 in_stack_ffffffffffffffd0,pacVar4,in_stack_ffffffffffffffe0);
    }
    else {
      iVar2 = sqlite3_backup_step(lVar3,0xffffffff);
      if (iVar2 == 0x65) {
        iVar2 = sqlite3_backup_finish(lVar3);
        sqlite3_close(in_stack_ffffffffffffffe0);
        bVar5 = iVar2 == 0;
        goto LAB_00c8d60a;
      }
      pacVar4 = (char (*) [7])sqlite3_errstr(iVar2);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file_00._M_len = 0x5a;
      logging_function_00._M_str = "Backup";
      logging_function_00._M_len = 6;
      LogPrintf_<char[7],char_const*>
                (logging_function_00,source_file_00,0x16b,0x1139775,(Level)&stack0xffffffffffffffd8,
                 in_stack_ffffffffffffffd0,pacVar4,in_stack_ffffffffffffffe0);
      sqlite3_backup_finish(lVar3);
    }
  }
  sqlite3_close(in_stack_ffffffffffffffe0);
  bVar5 = false;
LAB_00c8d60a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool SQLiteDatabase::Backup(const std::string& dest) const
{
    sqlite3* db_copy;
    int res = sqlite3_open(dest.c_str(), &db_copy);
    if (res != SQLITE_OK) {
        sqlite3_close(db_copy);
        return false;
    }
    sqlite3_backup* backup = sqlite3_backup_init(db_copy, "main", m_db, "main");
    if (!backup) {
        LogPrintf("%s: Unable to begin backup: %s\n", __func__, sqlite3_errmsg(m_db));
        sqlite3_close(db_copy);
        return false;
    }
    // Specifying -1 will copy all of the pages
    res = sqlite3_backup_step(backup, -1);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to backup: %s\n", __func__, sqlite3_errstr(res));
        sqlite3_backup_finish(backup);
        sqlite3_close(db_copy);
        return false;
    }
    res = sqlite3_backup_finish(backup);
    sqlite3_close(db_copy);
    return res == SQLITE_OK;
}